

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O1

CURLSHcode curl_share_setopt(Curl_share *share,CURLSHoption option,...)

{
  byte bVar1;
  int iVar2;
  CookieInfo *pCVar3;
  CURLSHcode CVar4;
  bool bVar5;
  va_list param;
  curl_lock_function local_b8;
  
  if (share->dirty != 0) {
    return CURLSHE_IN_USE;
  }
  CVar4 = CURLSHE_BAD_OPTION;
  switch(option) {
  case CURLSHOPT_SHARE:
    share->specifier = share->specifier | 1 << ((byte)local_b8 & 0x1f);
    switch(local_b8._0_4_) {
    case 2:
      if (share->cookies != (CookieInfo *)0x0) {
        return CURLSHE_OK;
      }
      pCVar3 = Curl_cookie_init((Curl_easy *)0x0,(char *)0x0,(CookieInfo *)0x0,true);
      share->cookies = pCVar3;
      break;
    default:
      return CURLSHE_OK;
    case 4:
      if (share->sslsession != (curl_ssl_session *)0x0) {
        return CURLSHE_OK;
      }
      share->max_ssl_sessions = 8;
      pCVar3 = (CookieInfo *)(*Curl_ccalloc)(8,0x88);
      share->sslsession = (curl_ssl_session *)pCVar3;
      share->sessionage = 0;
      break;
    case 5:
      iVar2 = Curl_conncache_init(&share->conn_cache,0x67);
      bVar5 = iVar2 != 0;
      goto LAB_0049ec66;
    case 6:
      return CURLSHE_NOT_BUILT_IN;
    }
    bVar5 = pCVar3 == (CookieInfo *)0x0;
LAB_0049ec66:
    return (uint)bVar5 << 2;
  case CURLSHOPT_UNSHARE:
    bVar1 = (byte)local_b8 & 0x1f;
    share->specifier = share->specifier & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
    switch(local_b8._0_4_) {
    case 2:
      goto switchD_0049ebb3_caseD_2;
    default:
      return CURLSHE_OK;
    case 4:
      (*Curl_cfree)(share->sslsession);
      share->sslsession = (curl_ssl_session *)0x0;
      return CURLSHE_OK;
    }
  case CURLSHOPT_LOCKFUNC:
    share->lockfunc = local_b8;
    break;
  case CURLSHOPT_UNLOCKFUNC:
    share->unlockfunc = (curl_unlock_function)local_b8;
    break;
  case CURLSHOPT_USERDATA:
    share->clientdata = local_b8;
    break;
  default:
    goto switchD_0049ea47_default;
  }
  CVar4 = CURLSHE_OK;
switchD_0049ea47_default:
  return CVar4;
switchD_0049ebb3_caseD_2:
  if (share->cookies == (CookieInfo *)0x0) {
    return CURLSHE_OK;
  }
  Curl_cookie_cleanup(share->cookies);
  share->cookies = (CookieInfo *)0x0;
  return CURLSHE_OK;
}

Assistant:

CURLSHcode
curl_share_setopt(struct Curl_share *share, CURLSHoption option, ...)
{
  va_list param;
  int type;
  curl_lock_function lockfunc;
  curl_unlock_function unlockfunc;
  void *ptr;
  CURLSHcode res = CURLSHE_OK;

  if(share->dirty)
    /* don't allow setting options while one or more handles are already
       using this share */
    return CURLSHE_IN_USE;

  va_start(param, option);

  switch(option) {
  case CURLSHOPT_SHARE:
    /* this is a type this share will share */
    type = va_arg(param, int);
    share->specifier |= (1<<type);
    switch(type) {
    case CURL_LOCK_DATA_DNS:
      break;

    case CURL_LOCK_DATA_COOKIE:
#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_COOKIES)
      if(!share->cookies) {
        share->cookies = Curl_cookie_init(NULL, NULL, NULL, TRUE);
        if(!share->cookies)
          res = CURLSHE_NOMEM;
      }
#else   /* CURL_DISABLE_HTTP */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_SSL_SESSION:
#ifdef USE_SSL
      if(!share->sslsession) {
        share->max_ssl_sessions = 8;
        share->sslsession = calloc(share->max_ssl_sessions,
                                   sizeof(struct curl_ssl_session));
        share->sessionage = 0;
        if(!share->sslsession)
          res = CURLSHE_NOMEM;
      }
#else
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_CONNECT:     /* not supported (yet) */
      if(Curl_conncache_init(&share->conn_cache, 103))
        res = CURLSHE_NOMEM;
      break;

    case CURL_LOCK_DATA_PSL:
#ifndef USE_LIBPSL
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    default:
      res = CURLSHE_BAD_OPTION;
    }
    break;

  case CURLSHOPT_UNSHARE:
    /* this is a type this share will no longer share */
    type = va_arg(param, int);
    share->specifier &= ~(1<<type);
    switch(type) {
    case CURL_LOCK_DATA_DNS:
      break;

    case CURL_LOCK_DATA_COOKIE:
#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_COOKIES)
      if(share->cookies) {
        Curl_cookie_cleanup(share->cookies);
        share->cookies = NULL;
      }
#else   /* CURL_DISABLE_HTTP */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_SSL_SESSION:
#ifdef USE_SSL
      Curl_safefree(share->sslsession);
#else
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_CONNECT:
      break;

    default:
      res = CURLSHE_BAD_OPTION;
      break;
    }
    break;

  case CURLSHOPT_LOCKFUNC:
    lockfunc = va_arg(param, curl_lock_function);
    share->lockfunc = lockfunc;
    break;

  case CURLSHOPT_UNLOCKFUNC:
    unlockfunc = va_arg(param, curl_unlock_function);
    share->unlockfunc = unlockfunc;
    break;

  case CURLSHOPT_USERDATA:
    ptr = va_arg(param, void *);
    share->clientdata = ptr;
    break;

  default:
    res = CURLSHE_BAD_OPTION;
    break;
  }

  va_end(param);

  return res;
}